

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::EnumValBuilder::AcceptEnumerator(EnumValBuilder *this,string *name)

{
  string *msg;
  bool bVar1;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_29;
  uint local_28;
  bool not_unique;
  string *local_20;
  string *name_local;
  EnumValBuilder *this_local;
  CheckedError *ce;
  
  name_local = name;
  this_local = this;
  if ((name->field_2)._M_allocated_capacity == 0) {
    __assert_fail("temp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                  ,0x960,
                  "CheckedError flatbuffers::EnumValBuilder::AcceptEnumerator(const std::string &)")
    ;
  }
  not_unique = false;
  local_20 = in_RDX;
  ValidateValue(this,(int64_t *)name,(bool)((char)(name->field_2)._M_allocated_capacity + -0x60));
  bVar1 = CheckedError::Check((CheckedError *)this);
  if (bVar1) {
    not_unique = true;
  }
  local_28 = (uint)bVar1;
  if ((not_unique & 1U) == 0) {
    CheckedError::~CheckedError((CheckedError *)this);
  }
  if (local_28 == 0) {
    bVar1 = true;
    if (*(long *)((name->field_2)._M_allocated_capacity + 0x48) != 0) {
      bVar1 = *(size_type *)((name->field_2)._M_allocated_capacity + 0x48) == name->_M_string_length
      ;
    }
    if (!bVar1) {
      __assert_fail("(temp->union_type.enum_def == nullptr) || (temp->union_type.enum_def == &enum_def)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                    ,0x963,
                    "CheckedError flatbuffers::EnumValBuilder::AcceptEnumerator(const std::string &)"
                   );
    }
    local_29 = SymbolTable<flatbuffers::EnumVal>::Add
                         ((SymbolTable<flatbuffers::EnumVal> *)(name->_M_string_length + 0xf0),
                          local_20,(EnumVal *)(name->field_2)._M_allocated_capacity);
    (name->field_2)._M_allocated_capacity = 0;
    if ((bool)local_29) {
      msg = *(string **)name;
      std::operator+(&local_50,"enum value already exists: ",local_20);
      Parser::Error((Parser *)this,msg);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      anon_unknown_0::NoError();
    }
  }
  return SUB82(this,0);
}

Assistant:

FLATBUFFERS_CHECKED_ERROR AcceptEnumerator(const std::string &name) {
    FLATBUFFERS_ASSERT(temp);
    ECHECK(ValidateValue(&temp->value, false == user_value));
    FLATBUFFERS_ASSERT((temp->union_type.enum_def == nullptr) ||
                       (temp->union_type.enum_def == &enum_def));
    auto not_unique = enum_def.vals.Add(name, temp);
    temp = nullptr;
    if (not_unique) return parser.Error("enum value already exists: " + name);
    return NoError();
  }